

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O0

void tcu::writeCaselistsToStdout(TestPackageRoot *root,TestContext *testCtx)

{
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> data;
  bool bVar1;
  State SVar2;
  TestNodeType TVar3;
  CommandLine *this;
  Archive *archive;
  CaseListFilter *caseListFilter_00;
  TestNode *pTVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  CaseListFilter *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 local_b0 [8];
  TestHierarchyIterator iter;
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> local_58;
  PtrData<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *local_48;
  undefined1 local_38 [8];
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  TestContext *testCtx_local;
  TestPackageRoot *root_local;
  
  DefaultHierarchyInflater::DefaultHierarchyInflater
            ((DefaultHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8,testCtx);
  this = TestContext::getCommandLine(testCtx);
  archive = TestContext::getArchive(testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_58,
             this,archive);
  local_48 = de::details::MovePtr::operator_cast_to_PtrData(&local_58,(MovePtr *)this);
  data._8_8_ = in_stack_fffffffffffffef0;
  data.ptr = in_stack_fffffffffffffee8;
  de::details::MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
  MovePtr((MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *)
          local_38,data);
  de::details::MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::~MovePtr
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_58);
  caseListFilter_00 =
       de::details::
       UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
       operator*((UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                  *)local_38);
  TestHierarchyIterator::TestHierarchyIterator
            ((TestHierarchyIterator *)local_b0,root,
             (TestHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8,caseListFilter_00);
  while( true ) {
    SVar2 = TestHierarchyIterator::getState((TestHierarchyIterator *)local_b0);
    if (SVar2 == STATE_FINISHED) break;
    TestHierarchyIterator::next((TestHierarchyIterator *)local_b0);
    while( true ) {
      pTVar4 = TestHierarchyIterator::getNode((TestHierarchyIterator *)local_b0);
      TVar3 = TestNode::getNodeType(pTVar4);
      if (TVar3 == NODETYPE_PACKAGE) break;
      SVar2 = TestHierarchyIterator::getState((TestHierarchyIterator *)local_b0);
      if (SVar2 == STATE_ENTER_NODE) {
        pTVar4 = TestHierarchyIterator::getNode((TestHierarchyIterator *)local_b0);
        TVar3 = TestNode::getNodeType(pTVar4);
        bVar1 = isTestNodeTypeExecutable(TVar3);
        pcVar7 = "GROUP";
        if (bVar1) {
          pcVar7 = "TEST";
        }
        poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
        poVar5 = std::operator<<(poVar5,": ");
        psVar6 = TestHierarchyIterator::getNodePath_abi_cxx11_((TestHierarchyIterator *)local_b0);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::operator<<(poVar5,"\n");
      }
      TestHierarchyIterator::next((TestHierarchyIterator *)local_b0);
    }
    TestHierarchyIterator::next((TestHierarchyIterator *)local_b0);
  }
  TestHierarchyIterator::~TestHierarchyIterator((TestHierarchyIterator *)local_b0);
  de::details::MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
  ~MovePtr((MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> *)
           local_38);
  DefaultHierarchyInflater::~DefaultHierarchyInflater
            ((DefaultHierarchyInflater *)
             &caseListFilter.
              super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
              .m_data.field_0x8);
  return;
}

Assistant:

static void writeCaselistsToStdout (TestPackageRoot& root, TestContext& testCtx)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));
	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		iter.next();

		while (iter.getNode()->getNodeType() != NODETYPE_PACKAGE)
		{
			if (iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE)
				std::cout << (isTestNodeTypeExecutable(iter.getNode()->getNodeType()) ? "TEST" : "GROUP") << ": " << iter.getNodePath() << "\n";
			iter.next();
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}